

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

bool resize_buf_if_needed(char **__dest,size_t *__dest_size,size_t __n)

{
  undefined8 uVar1;
  ulong in_RDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  stringstream __msg;
  char *new_dest;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1b0 [16];
  ostream local_1a0;
  void *local_28;
  ulong local_20;
  ulong *local_18;
  undefined8 *local_10;
  bool local_1;
  
  if (*in_RSI < in_RDX) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_28 = realloc((void *)*in_RDI,in_RDX);
    if (local_28 == (void *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<(&local_1a0,"Can\'t realloc enough memory.");
      uVar1 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                 in_stack_fffffffffffffe28);
      __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *local_10 = local_28;
    *local_18 = local_20;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool resize_buf_if_needed(char*& __dest, size_t& __dest_size, const size_t __n)
{
  char* new_dest;
  if (__dest_size < __n)
  {
    if ((new_dest = (char*)realloc(__dest, __n)) == NULL)
      THROW("Can't realloc enough memory.")
    else
    {
      __dest = new_dest;
      __dest_size = __n;
      return true;
    }
  }
  return false;
}